

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O3

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
sort_fn<std::greater<void>>::operator()
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          sort_fn<std::greater<void>> *this,vector<signed_char,_std::allocator<signed_char>_> *c)

{
  long lVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  pcVar2 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar2 != pcVar3) {
    lVar1 = 0x3f;
    if ((long)pcVar3 - (long)pcVar2 != 0) {
      for (; (ulong)((long)pcVar3 - (long)pcVar2) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (pcVar2,pcVar3,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (pcVar2,pcVar3);
    pcVar2 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = pcVar2;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = pcVar3;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end(), compare);
        return c;
    }